

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

int variance_final_1024_avx2(__m256i vsse,__m256i vsum,uint *sse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256i val;
  __m128i vsum_65;
  __m256i vsse_00;
  int iVar3;
  uint *in_XMM0_Qa;
  longlong in_XMM0_Qb;
  undefined1 auVar4 [16];
  longlong in_YMM0_H;
  undefined8 in_register_00001218;
  ulong in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  __m128i vsum_64;
  __m128i vsum_128;
  undefined1 in_stack_ffffffffffffff00 [16];
  longlong in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff80 [16];
  
  val._8_16_ = in_stack_ffffffffffffff00;
  val[0] = 0x64b8ab;
  val[3] = in_stack_ffffffffffffff10;
  mm256_add_hi_lo_epi16(val);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_XMM1_Qa;
  auVar1 = vpmovsxwd_avx(auVar1);
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = in_XMM1_Qa;
  auVar4 = vpsrldq_avx(auVar4,8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = auVar4._0_8_;
  auVar2 = vpmovsxwd_avx(auVar2);
  vpaddd_avx(auVar1,auVar2);
  vsse_00[1] = in_stack_ffffffffffffff80._0_8_;
  vsse_00[2] = in_stack_ffffffffffffff80._8_8_;
  vsse_00[0] = in_register_00001218;
  vsse_00[3] = auVar4._0_8_;
  vsum_65[1] = in_YMM0_H;
  vsum_65[0] = in_XMM0_Qb;
  iVar3 = variance_final_from_32bit_sum_avx2(vsse_00,vsum_65,in_XMM0_Qa);
  return iVar3;
}

Assistant:

static inline int variance_final_1024_avx2(__m256i vsse, __m256i vsum,
                                           unsigned int *const sse) {
  // extract the low lane and add it to the high lane
  const __m128i vsum_128 = mm256_add_hi_lo_epi16(vsum);
  const __m128i vsum_64 =
      _mm_add_epi32(_mm_cvtepi16_epi32(vsum_128),
                    _mm_cvtepi16_epi32(_mm_srli_si128(vsum_128, 8)));
  return variance_final_from_32bit_sum_avx2(vsse, vsum_64, sse);
}